

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_type __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>>>
::
erase<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>>>
           *this,key_arg<Int> *key)

{
  ulong uVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  slot_type *pptVar4;
  uint uVar5;
  int iVar6;
  ushort uVar7;
  ushort uVar8;
  char *pcVar9;
  ctrl_t h;
  ulong uVar10;
  long lVar11;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  *this_00;
  size_t i;
  ulong uVar12;
  long lVar13;
  ulong in_R9;
  byte in_R11B;
  uint uVar14;
  char *pcVar15;
  bool bVar16;
  __m128i match;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  __m128i match_1;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  char cVar21;
  char cVar23;
  char cVar24;
  char cVar25;
  
  uVar1 = key->value;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  uVar10 = SUB168(auVar17 * ZEXT816(0xde5fb9d2630458e9),8) +
           SUB168(auVar17 * ZEXT816(0xde5fb9d2630458e9),0);
  uVar12 = (ulong)((((uint)(uVar10 >> 0x18) & 0xff ^
                    (uint)(uVar10 >> 8) & 0xffffff ^ (uint)(uVar10 >> 0x10) & 0xffff) & 0xf) * 0x30)
  ;
  uVar2 = *(ulong *)(this + uVar12 + 0x18);
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  this_00 = (raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             *)(this + uVar12);
  uVar12 = uVar10 >> 7 & uVar2;
  pcVar3 = this_00->ctrl_;
  pptVar4 = this_00->slots_;
  auVar17 = ZEXT216(CONCAT11((char)uVar10,(char)uVar10) & 0x7f7f);
  auVar17 = pshuflw(auVar17,auVar17,0);
  lVar11 = 0;
  do {
    pcVar15 = pcVar3 + uVar12;
    cVar21 = auVar17[0];
    auVar22[0] = -(cVar21 == *pcVar15);
    cVar23 = auVar17[1];
    auVar22[1] = -(cVar23 == pcVar15[1]);
    cVar24 = auVar17[2];
    auVar22[2] = -(cVar24 == pcVar15[2]);
    cVar25 = auVar17[3];
    auVar22[3] = -(cVar25 == pcVar15[3]);
    auVar22[4] = -(cVar21 == pcVar15[4]);
    auVar22[5] = -(cVar23 == pcVar15[5]);
    auVar22[6] = -(cVar24 == pcVar15[6]);
    auVar22[7] = -(cVar25 == pcVar15[7]);
    auVar22[8] = -(cVar21 == pcVar15[8]);
    auVar22[9] = -(cVar23 == pcVar15[9]);
    auVar22[10] = -(cVar24 == pcVar15[10]);
    auVar22[0xb] = -(cVar25 == pcVar15[0xb]);
    auVar22[0xc] = -(cVar21 == pcVar15[0xc]);
    auVar22[0xd] = -(cVar23 == pcVar15[0xd]);
    auVar22[0xe] = -(cVar24 == pcVar15[0xe]);
    auVar22[0xf] = -(cVar25 == pcVar15[0xf]);
    uVar7 = (ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf;
    bVar16 = uVar7 == 0;
    if (!bVar16) {
      uVar14 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
        }
      }
      in_R9 = uVar14 + uVar12 & uVar2;
      uVar10 = (pptVar4[in_R9]->first).value;
      in_R11B = uVar10 == uVar1 | in_R11B;
      if (uVar10 == uVar1) {
        bVar16 = false;
      }
      else {
        uVar14 = uVar7 - 1 & (uint)uVar7;
        if (uVar14 == 0) {
          bVar16 = true;
        }
        else {
          do {
            uVar5 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            in_R9 = uVar5 + uVar12 & uVar2;
            uVar10 = (pptVar4[in_R9]->first).value;
            in_R11B = uVar10 == uVar1 | in_R11B;
          } while ((uVar10 != uVar1) && (uVar14 = uVar14 - 1 & uVar14, uVar14 != 0));
          bVar16 = uVar10 != uVar1;
        }
      }
    }
    if (bVar16) {
      auVar20[0] = -(*pcVar15 == -0x80);
      auVar20[1] = -(pcVar15[1] == -0x80);
      auVar20[2] = -(pcVar15[2] == -0x80);
      auVar20[3] = -(pcVar15[3] == -0x80);
      auVar20[4] = -(pcVar15[4] == -0x80);
      auVar20[5] = -(pcVar15[5] == -0x80);
      auVar20[6] = -(pcVar15[6] == -0x80);
      auVar20[7] = -(pcVar15[7] == -0x80);
      auVar20[8] = -(pcVar15[8] == -0x80);
      auVar20[9] = -(pcVar15[9] == -0x80);
      auVar20[10] = -(pcVar15[10] == -0x80);
      auVar20[0xb] = -(pcVar15[0xb] == -0x80);
      auVar20[0xc] = -(pcVar15[0xc] == -0x80);
      auVar20[0xd] = -(pcVar15[0xd] == -0x80);
      auVar20[0xe] = -(pcVar15[0xe] == -0x80);
      auVar20[0xf] = -(pcVar15[0xf] == -0x80);
      if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar20 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar20 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar20 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar20 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar20 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar20 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar20 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar20 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar20 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar20 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar20 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar20 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar20 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar20 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar20[0xf])
      {
        lVar13 = uVar12 + lVar11;
        lVar11 = lVar11 + 0x10;
        uVar12 = lVar13 + 0x10U & uVar2;
        bVar16 = true;
      }
      else {
        bVar16 = false;
        in_R11B = 0;
      }
    }
    else {
      bVar16 = false;
    }
  } while (bVar16);
  pcVar9 = pcVar3 + uVar2;
  pcVar15 = pcVar3 + in_R9;
  if ((in_R11B & 1) == 0) {
    pcVar15 = pcVar9;
  }
  if (pcVar15 != pcVar9) {
    operator_delete(pptVar4[in_R9],0x10);
    if (*pcVar15 < '\0') {
      __assert_fail("IsFull(*it.inner_.ctrl_) && \"erasing a dangling iterator\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x7c8,
                    "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<Int, Int>, Hash, phmap::EqualTo<Int>, std::allocator<std::pair<const Int, Int>>>::erase_meta_only(const_iterator) [Policy = phmap::priv::NodeHashMapPolicy<Int, Int>, Hash = Hash, Eq = phmap::EqualTo<Int>, Alloc = std::allocator<std::pair<const Int, Int>>]"
                   );
    }
    this_00->size_ = this_00->size_ - 1;
    i = (long)pcVar15 - (long)this_00->ctrl_;
    pcVar9 = this_00->ctrl_ + (i - 0x10 & this_00->capacity_);
    auVar18[0] = -(*pcVar9 == -0x80);
    auVar18[1] = -(pcVar9[1] == -0x80);
    auVar18[2] = -(pcVar9[2] == -0x80);
    auVar18[3] = -(pcVar9[3] == -0x80);
    auVar18[4] = -(pcVar9[4] == -0x80);
    auVar18[5] = -(pcVar9[5] == -0x80);
    auVar18[6] = -(pcVar9[6] == -0x80);
    auVar18[7] = -(pcVar9[7] == -0x80);
    auVar18[8] = -(pcVar9[8] == -0x80);
    auVar18[9] = -(pcVar9[9] == -0x80);
    auVar18[10] = -(pcVar9[10] == -0x80);
    auVar18[0xb] = -(pcVar9[0xb] == -0x80);
    auVar18[0xc] = -(pcVar9[0xc] == -0x80);
    auVar18[0xd] = -(pcVar9[0xd] == -0x80);
    auVar18[0xe] = -(pcVar9[0xe] == -0x80);
    auVar18[0xf] = -(pcVar9[0xf] == -0x80);
    uVar7 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf;
    bVar16 = false;
    if (uVar7 != 0) {
      auVar19[0] = -(*pcVar15 == -0x80);
      auVar19[1] = -(pcVar15[1] == -0x80);
      auVar19[2] = -(pcVar15[2] == -0x80);
      auVar19[3] = -(pcVar15[3] == -0x80);
      auVar19[4] = -(pcVar15[4] == -0x80);
      auVar19[5] = -(pcVar15[5] == -0x80);
      auVar19[6] = -(pcVar15[6] == -0x80);
      auVar19[7] = -(pcVar15[7] == -0x80);
      auVar19[8] = -(pcVar15[8] == -0x80);
      auVar19[9] = -(pcVar15[9] == -0x80);
      auVar19[10] = -(pcVar15[10] == -0x80);
      auVar19[0xb] = -(pcVar15[0xb] == -0x80);
      auVar19[0xc] = -(pcVar15[0xc] == -0x80);
      auVar19[0xd] = -(pcVar15[0xd] == -0x80);
      auVar19[0xe] = -(pcVar15[0xe] == -0x80);
      auVar19[0xf] = -(pcVar15[0xf] == -0x80);
      uVar8 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
      if (uVar8 != 0) {
        iVar6 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        uVar14 = 0x1f;
        if (uVar7 != 0) {
          for (; ((uint)uVar7 << 0x10) >> uVar14 == 0; uVar14 = uVar14 - 1) {
          }
        }
        bVar16 = (uVar14 ^ 0x1f) + iVar6 < 0x10;
      }
    }
    h = -2;
    if (bVar16 != false) {
      h = -0x80;
    }
    raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
    ::set_ctrl(this_00,i,h);
    pcVar9 = (char *)(ulong)bVar16;
    (this_00->settings_).
    super__Tuple_impl<0UL,_unsigned_long,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (unsigned_long)
         (pcVar9 + (this_00->settings_).
                   super__Tuple_impl<0UL,_unsigned_long,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                   .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
  }
  return (size_type)pcVar9;
}

Assistant:

size_type erase(const key_arg<K>& key) {
        auto always_erase =  [](const value_type&){ return true; };
        return erase_if_impl<K, decltype(always_erase), ReadWriteLock>(key, std::move(always_erase));
    }